

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int bucketSort(uint *begin,uint *end)

{
  uint *puVar1;
  int i;
  long lVar2;
  bool bucket [280005];
  char acStack_445d8 [280008];
  
  memset(acStack_445d8,0,0x445c5);
  puVar1 = begin;
  if (begin < end) {
    do {
      acStack_445d8[*puVar1] = '\x01';
      puVar1 = puVar1 + 1;
    } while (puVar1 < end);
  }
  lVar2 = 0;
  puVar1 = begin;
  do {
    if (acStack_445d8[lVar2] == '\x01') {
      *puVar1 = (uint)lVar2;
      puVar1 = puVar1 + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x445c5);
  return (int)((ulong)((long)puVar1 - (long)begin) >> 2);
}

Assistant:

int bucketSort(unsigned int *begin, const unsigned int *end) {
    unsigned int *p = begin;
    const int MAXID = maxSize;
    bool bucket[MAXID];
    memset(bucket, 0, sizeof(bucket));
    for (; p < end; ++p) {
        bucket[*p] = true;
    }
    p = begin;
    for (int i = 0; i < MAXID; i++) {
        if (bucket[i]) {
            *p = i;
            ++p;
        }
    }
    return p - begin;
}